

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

void Aig_ManComputeSccs(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *pVVar6;
  Vec_Ptr_t *p_02;
  void *__s;
  Vec_Int_t *pVVar7;
  int local_60;
  int nComps;
  int iIn;
  int iOut;
  int m;
  int k;
  int i;
  char *pVarsTot;
  Vec_Int_t *vComp;
  Vec_Int_t *vSupp2;
  Vec_Int_t *vSupp;
  Vec_Ptr_t *vMatrix2;
  Vec_Ptr_t *vMatrix;
  Vec_Ptr_t *vSupports;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 == 0) {
    printf("The network is combinational.\n");
  }
  else {
    p_00 = Aig_ManSupports(p);
    iVar1 = Aig_ManRegNum(p);
    p_01 = Vec_PtrStart(iVar1);
    for (m = 0; iVar1 = Vec_PtrSize(p_00), m < iVar1; m = m + 1) {
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_00,m);
      iVar2 = Vec_IntPop(pVVar6);
      iVar1 = Aig_ManCoNum(p);
      iVar4 = Aig_ManRegNum(p);
      iVar2 = iVar2 - (iVar1 - iVar4);
      if (-1 < iVar2) {
        iIn = 0;
        for (iOut = 0; iVar1 = Vec_IntSize(pVVar6), iOut < iVar1; iOut = iOut + 1) {
          iVar3 = Vec_IntEntry(pVVar6,iOut);
          iVar1 = Aig_ManCiNum(p);
          iVar4 = Aig_ManRegNum(p);
          iVar3 = iVar3 - (iVar1 - iVar4);
          if (-1 < iVar3) {
            iVar1 = Aig_ManRegNum(p);
            if (iVar1 <= iVar3) {
              __assert_fail("iIn < Aig_ManRegNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                            ,0x206,"void Aig_ManComputeSccs(Aig_Man_t *)");
            }
            Vec_IntWriteEntry(pVVar6,iIn,iVar3);
            iIn = iIn + 1;
          }
        }
        Vec_IntShrink(pVVar6,iIn);
        iVar1 = Aig_ManRegNum(p);
        if (iVar1 <= iVar2) {
          __assert_fail("iOut < Aig_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                        ,0x20b,"void Aig_ManComputeSccs(Aig_Man_t *)");
        }
        Vec_PtrWriteEntry(p_01,iVar2,pVVar6);
      }
    }
    iVar1 = Aig_ManRegNum(p);
    p_02 = Vec_PtrAlloc(iVar1);
    for (m = 0; iVar1 = Aig_ManRegNum(p), m < iVar1; m = m + 1) {
      pVVar6 = Vec_IntAlloc(8);
      Vec_PtrPush(p_02,pVVar6);
    }
    for (m = 0; iVar1 = Vec_PtrSize(p_01), m < iVar1; m = m + 1) {
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_01,m);
      for (iOut = 0; iVar1 = Vec_IntSize(pVVar6), iOut < iVar1; iOut = iOut + 1) {
        iVar1 = Vec_IntEntry(pVVar6,iOut);
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_02,iVar1);
        Vec_IntPush(pVVar7,m);
      }
    }
    iVar1 = Aig_ManRegNum(p);
    pVVar6 = Vec_IntAlloc(iVar1);
    iVar1 = Aig_ManRegNum(p);
    __s = malloc((long)iVar1);
    iVar1 = Aig_ManRegNum(p);
    memset(__s,0,(long)iVar1);
    local_60 = 0;
    while( true ) {
      Vec_IntClear(pVVar6);
      for (nComps = 0;
          (iVar1 = Aig_ManRegNum(p), nComps < iVar1 && (*(char *)((long)__s + (long)nComps) != '\0')
          ); nComps = nComps + 1) {
      }
      iVar1 = Aig_ManRegNum(p);
      if (nComps == iVar1) goto LAB_008b007e;
      *(undefined1 *)((long)__s + (long)nComps) = 1;
      Vec_IntPush(pVVar6,nComps);
      for (m = 0; iVar1 = Vec_IntSize(pVVar6), m < iVar1; m = m + 1) {
        iVar1 = Vec_IntEntry(pVVar6,m);
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_01,iVar1);
        for (iOut = 0; iVar4 = Vec_IntSize(pVVar7), iOut < iVar4; iOut = iOut + 1) {
          iVar4 = Vec_IntEntry(pVVar7,iOut);
          if (*(char *)((long)__s + (long)iVar4) == '\0') {
            *(undefined1 *)((long)__s + (long)iVar4) = 1;
            Vec_IntPush(pVVar6,iVar4);
          }
        }
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_02,iVar1);
        for (iOut = 0; iVar1 = Vec_IntSize(pVVar7), iOut < iVar1; iOut = iOut + 1) {
          iVar1 = Vec_IntEntry(pVVar7,iOut);
          if (*(char *)((long)__s + (long)iVar1) == '\0') {
            *(undefined1 *)((long)__s + (long)iVar1) = 1;
            Vec_IntPush(pVVar6,iVar1);
          }
        }
      }
      iVar1 = Vec_IntSize(pVVar6);
      iVar4 = Aig_ManRegNum(p);
      if (iVar1 == iVar4) break;
      uVar5 = Vec_IntSize(pVVar6);
      printf("SCC #%d contains %5d registers.\n",(ulong)(local_60 + 1),(ulong)uVar5);
      local_60 = local_60 + 1;
    }
    printf("There is only one SCC of registers in this network.\n");
LAB_008b007e:
    if (__s != (void *)0x0) {
      free(__s);
    }
    Vec_IntFree(pVVar6);
    Vec_PtrFree(p_01);
    Vec_VecFree((Vec_Vec_t *)p_02);
    Vec_VecFree((Vec_Vec_t *)p_00);
  }
  return;
}

Assistant:

void Aig_ManComputeSccs( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupports, * vMatrix, * vMatrix2;
    Vec_Int_t * vSupp, * vSupp2, * vComp;
    char * pVarsTot;
    int i, k, m, iOut, iIn, nComps;
    if ( Aig_ManRegNum(p) == 0 )
    {
        printf( "The network is combinational.\n" );
        return;
    }
    // get structural supports for each output
    vSupports = Aig_ManSupports( p );
    // transforms the supports into the latch dependency matrix
    vMatrix = Vec_PtrStart( Aig_ManRegNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
    {
        // skip true POs
        iOut = Vec_IntPop( vSupp );
        iOut -= Aig_ManCoNum(p) - Aig_ManRegNum(p);
        if ( iOut < 0 )
            continue;
        // remove PIs
        m = 0;
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            iIn -= Aig_ManCiNum(p) - Aig_ManRegNum(p);
            if ( iIn < 0 )
                continue;
            assert( iIn < Aig_ManRegNum(p) );
            Vec_IntWriteEntry( vSupp, m++, iIn );
        }
        Vec_IntShrink( vSupp, m );
        // store support in the matrix
        assert( iOut < Aig_ManRegNum(p) );
        Vec_PtrWriteEntry( vMatrix, iOut, vSupp );
    }
    // create the reverse matrix
    vMatrix2 = Vec_PtrAlloc( Aig_ManRegNum(p) );
    for ( i = 0; i < Aig_ManRegNum(p); i++ )
        Vec_PtrPush( vMatrix2, Vec_IntAlloc(8) );
    Vec_PtrForEachEntry( Vec_Int_t *, vMatrix, vSupp, i )
    {
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            vSupp2 = (Vec_Int_t *)Vec_PtrEntry( vMatrix2, iIn );
            Vec_IntPush( vSupp2, i );
        }
    } 

    // detect strongly connected components
    vComp = Vec_IntAlloc( Aig_ManRegNum(p) );
    pVarsTot = ABC_ALLOC( char, Aig_ManRegNum(p) );
    memset( pVarsTot, 0, Aig_ManRegNum(p) * sizeof(char) );
    for ( nComps = 0; ; nComps++ )
    {
        Vec_IntClear( vComp );
        // get the first support
        for ( iOut = 0; iOut < Aig_ManRegNum(p); iOut++ )
            if ( pVarsTot[iOut] == 0 )
                break;
        if ( iOut == Aig_ManRegNum(p) )
            break;
        pVarsTot[iOut] = 1;
        Vec_IntPush( vComp, iOut );
        Vec_IntForEachEntry( vComp, iOut, i )
        {
            vSupp = (Vec_Int_t *)Vec_PtrEntry( vMatrix, iOut );
            Vec_IntForEachEntry( vSupp, iIn, k )
            {
                if ( pVarsTot[iIn] )
                    continue;
                pVarsTot[iIn] = 1;
                Vec_IntPush( vComp, iIn );
            }
            vSupp2 = (Vec_Int_t *)Vec_PtrEntry( vMatrix2, iOut );
            Vec_IntForEachEntry( vSupp2, iIn, k )
            {
                if ( pVarsTot[iIn] )
                    continue;
                pVarsTot[iIn] = 1;
                Vec_IntPush( vComp, iIn );
            }
        }
        if ( Vec_IntSize(vComp) == Aig_ManRegNum(p) )
        {
            printf( "There is only one SCC of registers in this network.\n" );
            break;
        }
        printf( "SCC #%d contains %5d registers.\n", nComps+1, Vec_IntSize(vComp) );
    }
    ABC_FREE( pVarsTot );
    Vec_IntFree( vComp );
    Vec_PtrFree( vMatrix );
    Vec_VecFree( (Vec_Vec_t *)vMatrix2 );
    Vec_VecFree( (Vec_Vec_t *)vSupports );
}